

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadialDistrFunc.cpp
# Opt level: O0

void __thiscall
OpenMD::RadialDistrFunc::processNonOverlapping
          (RadialDistrFunc *this,SelectionManager *sman1,SelectionManager *sman2)

{
  SelectionManager *this_00;
  long *in_RDI;
  int j;
  int i;
  StuntDouble *sd2;
  StuntDouble *sd1;
  StuntDouble *in_stack_ffffffffffffffd8;
  SelectionManager *in_stack_ffffffffffffffe0;
  
  for (this_00 = (SelectionManager *)
                 SelectionManager::beginSelected
                           (in_stack_ffffffffffffffe0,(int *)in_stack_ffffffffffffffd8);
      this_00 != (SelectionManager *)0x0;
      this_00 = (SelectionManager *)SelectionManager::nextSelected(this_00,(int *)0x0)) {
    for (in_stack_ffffffffffffffd8 =
              SelectionManager::beginSelected(this_00,(int *)in_stack_ffffffffffffffd8);
        in_stack_ffffffffffffffd8 != (StuntDouble *)0x0;
        in_stack_ffffffffffffffd8 =
             SelectionManager::nextSelected(this_00,(int *)in_stack_ffffffffffffffd8)) {
      (**(code **)(*in_RDI + 0x48))(in_RDI,this_00,in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void RadialDistrFunc::processNonOverlapping(SelectionManager& sman1,
                                              SelectionManager& sman2) {
    StuntDouble* sd1;
    StuntDouble* sd2;
    int i;
    int j;

    // This is the same as a non-overlapping pairwise loop structure:
    // for (int i = 0;  i < ni ; ++i ) {
    //   for (int j = 0; j < nj; ++j) {}
    // }

    for (sd1 = sman1.beginSelected(i); sd1 != NULL;
         sd1 = sman1.nextSelected(i)) {
      for (sd2 = sman2.beginSelected(j); sd2 != NULL;
           sd2 = sman2.nextSelected(j)) {
        collectHistogram(sd1, sd2);
      }
    }
  }